

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O2

size_t ZSTD_compressBlock_btlazy2_extDict
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  int *iEnd;
  undefined8 *puVar1;
  undefined8 uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  size_t sVar7;
  ulong uVar8;
  ulong uVar9;
  BYTE *pBVar10;
  U32 UVar11;
  int *piVar12;
  long lVar13;
  ulong uVar14;
  int *piVar15;
  int *piVar16;
  uint uVar17;
  U32 UVar18;
  BYTE *pBVar19;
  ulong uVar20;
  U32 UVar21;
  seqDef *psVar22;
  int iVar23;
  uint local_cc;
  size_t ofbCandidate;
  ZSTD_matchState_t *local_c0;
  uint local_b4;
  ulong local_b0;
  int local_a8;
  U32 maxDistance;
  int *local_a0;
  int *local_98;
  ulong local_90;
  BYTE *local_88;
  BYTE *local_80;
  BYTE *local_78;
  seqStore_t *local_70;
  int *local_68;
  int *local_60;
  int local_54;
  int *local_50;
  int *local_48;
  BYTE *local_40;
  U32 *local_38;
  
  local_88 = (ms->window).base;
  local_78 = (ms->window).dictBase;
  uVar4 = (ms->window).dictLimit;
  local_b0 = (ulong)uVar4;
  local_80 = local_88 + local_b0;
  local_68 = (int *)(local_78 + local_b0);
  local_40 = local_78 + (ms->window).lowLimit;
  uVar5 = (ms->cParams).windowLog;
  uVar3 = (ms->cParams).minMatch;
  uVar17 = 6;
  if (uVar3 < 6) {
    uVar17 = uVar3;
  }
  uVar3 = 4;
  if (4 < uVar17) {
    uVar3 = uVar17;
  }
  UVar21 = *rep;
  local_cc = rep[1];
  ms->lazySkipping = 0;
  maxDistance = 1 << ((byte)uVar5 & 0x1f);
  piVar15 = (int *)((ulong)(local_80 == (BYTE *)src) + (long)src);
  iEnd = (int *)((long)src + srcSize);
  local_60 = (int *)((long)src + (srcSize - 8));
  local_50 = (int *)((long)src + (srcSize - 0x20));
  local_a8 = uVar4 - 1;
  local_c0 = ms;
  local_70 = seqStore;
  piVar12 = (int *)src;
  local_38 = rep;
LAB_001ccd05:
  do {
    local_48 = piVar12;
    local_b4 = UVar21;
    if (local_60 <= piVar15) {
      *local_38 = local_b4;
      local_38[1] = local_cc;
      return (long)iEnd - (long)local_48;
    }
    iVar23 = (int)piVar15 - (int)local_88;
    iVar6 = iVar23 + 1;
    UVar21 = (ms->window).lowLimit;
    UVar11 = iVar6 - maxDistance;
    if (iVar6 - UVar21 <= maxDistance) {
      UVar11 = UVar21;
    }
    if (ms->loadedDictEnd != 0) {
      UVar11 = UVar21;
    }
    uVar4 = iVar6 - local_b4;
    pBVar10 = local_78;
    if ((uint)local_b0 <= uVar4) {
      pBVar10 = local_88;
    }
    local_a0 = (int *)((long)piVar15 + 1);
    if (local_a8 - uVar4 < 3) {
LAB_001ccdad:
      uVar14 = 0;
    }
    else {
      uVar14 = 0;
      if (local_b4 <= (iVar23 - UVar11) + 1) {
        if (*local_a0 != *(int *)(pBVar10 + uVar4)) goto LAB_001ccdad;
        piVar12 = local_68;
        if ((uint)local_b0 <= uVar4) {
          piVar12 = iEnd;
        }
        sVar7 = ZSTD_count_2segments
                          ((BYTE *)((long)piVar15 + 5),(BYTE *)((long)(pBVar10 + uVar4) + 4),
                           (BYTE *)iEnd,(BYTE *)piVar12,local_80);
        uVar14 = sVar7 + 4;
      }
    }
    ofbCandidate = 999999999;
    if (uVar3 == 6) {
      uVar8 = ZSTD_BtFindBestMatch_extDict_6(ms,(BYTE *)piVar15,(BYTE *)iEnd,&ofbCandidate);
    }
    else if (uVar3 == 5) {
      uVar8 = ZSTD_BtFindBestMatch_extDict_5(ms,(BYTE *)piVar15,(BYTE *)iEnd,&ofbCandidate);
    }
    else {
      uVar8 = ZSTD_BtFindBestMatch_extDict_4(ms,(BYTE *)piVar15,(BYTE *)iEnd,&ofbCandidate);
    }
    uVar9 = uVar14;
    if (uVar14 < uVar8) {
      uVar9 = uVar8;
    }
    if (uVar9 < 4) {
      uVar14 = (long)piVar15 - (long)local_48;
      piVar15 = (int *)((long)piVar15 + (uVar14 >> 8) + 1);
      ms->lazySkipping = (uint)(0x8ff < uVar14);
      UVar21 = local_b4;
      piVar12 = local_48;
      goto LAB_001ccd05;
    }
    uVar20 = 1;
    piVar12 = local_a0;
    if (uVar14 < uVar8) {
      uVar20 = ofbCandidate;
      piVar12 = piVar15;
    }
    while (local_a0 = piVar12, iVar6 = iVar23, uVar8 = uVar9, piVar16 = piVar15, uVar14 = uVar20,
          piVar16 < local_60) {
      local_98 = (int *)((long)piVar16 + 1);
      local_54 = iVar6 + 1;
      if (uVar20 == 0) {
        uVar20 = 0;
      }
      else {
        UVar21 = (ms->window).lowLimit;
        UVar11 = local_54 - maxDistance;
        if (local_54 - UVar21 <= maxDistance) {
          UVar11 = UVar21;
        }
        if (ms->loadedDictEnd != 0) {
          UVar11 = UVar21;
        }
        uVar4 = local_54 - local_b4;
        pBVar10 = local_88;
        if (uVar4 < (uint)local_b0) {
          pBVar10 = local_78;
        }
        if (((2 < local_a8 - uVar4) && (local_b4 <= local_54 - UVar11)) &&
           (*local_98 == *(int *)(pBVar10 + uVar4))) {
          piVar15 = iEnd;
          if (uVar4 < (uint)local_b0) {
            piVar15 = local_68;
          }
          sVar7 = ZSTD_count_2segments
                            ((BYTE *)((long)piVar16 + 5),(BYTE *)((long)(pBVar10 + uVar4) + 4),
                             (BYTE *)iEnd,(BYTE *)piVar15,local_80);
          uVar4 = ZSTD_highbit32((U32)uVar20);
          if ((sVar7 < 0xfffffffffffffffc) &&
             ((int)(((int)uVar8 * 3 - uVar4) + 1) < (int)(sVar7 + 4) * 3)) {
            local_a0 = local_98;
            uVar20 = 1;
            uVar8 = sVar7 + 4;
          }
        }
      }
      ofbCandidate = 999999999;
      local_90 = uVar20;
      if (uVar3 == 6) {
        uVar9 = ZSTD_BtFindBestMatch_extDict_6(local_c0,(BYTE *)local_98,(BYTE *)iEnd,&ofbCandidate)
        ;
      }
      else if (uVar3 == 5) {
        uVar9 = ZSTD_BtFindBestMatch_extDict_5(local_c0,(BYTE *)local_98,(BYTE *)iEnd,&ofbCandidate)
        ;
      }
      else {
        uVar9 = ZSTD_BtFindBestMatch_extDict_4(local_c0,(BYTE *)local_98,(BYTE *)iEnd,&ofbCandidate)
        ;
      }
      uVar20 = ofbCandidate;
      uVar4 = ZSTD_highbit32((U32)ofbCandidate);
      uVar5 = ZSTD_highbit32((U32)local_90);
      uVar14 = local_90;
      seqStore = local_70;
      if ((uVar9 < 4) ||
         (piVar15 = local_98, ms = local_c0, iVar23 = local_54, piVar12 = local_98,
         (int)((int)uVar9 * 4 - uVar4) <= (int)(((int)uVar8 * 4 - uVar5) + 4))) {
        if (local_60 <= local_98) break;
        piVar15 = (int *)((long)piVar16 + 2);
        iVar23 = iVar6 + 2;
        if (local_90 == 0) {
          uVar14 = 0;
        }
        else {
          UVar21 = (local_c0->window).lowLimit;
          UVar11 = iVar23 - maxDistance;
          if (iVar23 - UVar21 <= maxDistance) {
            UVar11 = UVar21;
          }
          if (local_c0->loadedDictEnd != 0) {
            UVar11 = UVar21;
          }
          uVar4 = iVar23 - local_b4;
          pBVar10 = local_88;
          if (uVar4 < (uint)local_b0) {
            pBVar10 = local_78;
          }
          if (((2 < local_a8 - uVar4) && (local_b4 <= iVar23 - UVar11)) &&
             (*piVar15 == *(int *)(pBVar10 + uVar4))) {
            piVar12 = iEnd;
            if (uVar4 < (uint)local_b0) {
              piVar12 = local_68;
            }
            local_98 = piVar15;
            sVar7 = ZSTD_count_2segments
                              ((BYTE *)((long)piVar16 + 6),(BYTE *)((long)(pBVar10 + uVar4) + 4),
                               (BYTE *)iEnd,(BYTE *)piVar12,local_80);
            uVar4 = ZSTD_highbit32((U32)uVar14);
            piVar15 = local_98;
            if ((sVar7 < 0xfffffffffffffffc) &&
               ((int)(((int)uVar8 * 4 + 1) - uVar4) < (int)(sVar7 + 4) * 4)) {
              local_a0 = local_98;
              uVar14 = 1;
              uVar8 = sVar7 + 4;
            }
          }
        }
        ofbCandidate = 999999999;
        local_90 = uVar14;
        if (uVar3 == 6) {
          uVar9 = ZSTD_BtFindBestMatch_extDict_6
                            (local_c0,(BYTE *)piVar15,(BYTE *)iEnd,&ofbCandidate);
        }
        else if (uVar3 == 5) {
          uVar9 = ZSTD_BtFindBestMatch_extDict_5
                            (local_c0,(BYTE *)piVar15,(BYTE *)iEnd,&ofbCandidate);
        }
        else {
          uVar9 = ZSTD_BtFindBestMatch_extDict_4
                            (local_c0,(BYTE *)piVar15,(BYTE *)iEnd,&ofbCandidate);
        }
        uVar20 = ofbCandidate;
        uVar4 = ZSTD_highbit32((U32)ofbCandidate);
        uVar5 = ZSTD_highbit32((U32)local_90);
        uVar14 = local_90;
        seqStore = local_70;
        if ((uVar9 < 4) ||
           (ms = local_c0, piVar12 = piVar15,
           (int)((int)uVar9 * 4 - uVar4) <= (int)(((int)uVar8 * 4 - uVar5) + 7))) break;
      }
    }
    piVar15 = local_a0;
    if (3 < uVar14) {
      uVar9 = (long)local_a0 + (-(long)local_88 - uVar14) + 3;
      pBVar19 = local_80;
      pBVar10 = local_88;
      if ((uint)uVar9 < (uint)local_b0) {
        pBVar19 = local_40;
        pBVar10 = local_78;
      }
      pBVar10 = pBVar10 + (uVar9 & 0xffffffff);
      for (; ((local_48 < piVar15 && (pBVar19 < pBVar10)) &&
             (*(BYTE *)((long)piVar15 + -1) == pBVar10[-1])); piVar15 = (int *)((long)piVar15 + -1))
      {
        pBVar10 = pBVar10 + -1;
        uVar8 = uVar8 + 1;
      }
      local_cc = local_b4;
      local_b4 = (U32)uVar14 - 3;
    }
    if (seqStore->maxNbSeq <=
        (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
LAB_001cd57f:
      __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,0x29d,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (0x20000 < seqStore->maxNbLit) {
LAB_001cd59e:
      __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,0x29f,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    uVar9 = (long)piVar15 - (long)local_48;
    pBVar10 = seqStore->lit;
    if (seqStore->litStart + seqStore->maxNbLit < pBVar10 + uVar9) {
LAB_001cd5dc:
      __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,0x2a0,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (iEnd < piVar15) {
LAB_001cd5fb:
      __assert_fail("literals + litLength <= litLimit",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,0x2a1,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (local_50 < piVar15) {
      ZSTD_safecopyLiterals(pBVar10,(BYTE *)local_48,(BYTE *)piVar15,(BYTE *)local_50);
LAB_001cd2b5:
      seqStore->lit = seqStore->lit + uVar9;
      if (0xffff < uVar9) {
        if (seqStore->longLengthType != ZSTD_llt_none) {
          __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x2b2,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        seqStore->longLengthType = ZSTD_llt_literalLength;
        seqStore->longLengthPos =
             (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
      }
    }
    else {
      uVar2 = *(undefined8 *)(local_48 + 2);
      *(undefined8 *)pBVar10 = *(undefined8 *)local_48;
      *(undefined8 *)(pBVar10 + 8) = uVar2;
      pBVar10 = seqStore->lit;
      if (0x10 < uVar9) {
        if ((BYTE *)0xffffffffffffffe0 < pBVar10 + 0x10 + (-0x10 - (long)(local_48 + 4))) {
          __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/../common/zstd_internal.h"
                        ,0xe9,
                        "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)")
          ;
        }
        uVar2 = *(undefined8 *)(local_48 + 6);
        *(undefined8 *)(pBVar10 + 0x10) = *(undefined8 *)(local_48 + 4);
        *(undefined8 *)(pBVar10 + 0x18) = uVar2;
        if (0x20 < (long)uVar9) {
          lVar13 = 0;
          do {
            puVar1 = (undefined8 *)((long)local_48 + lVar13 + 0x20);
            uVar2 = puVar1[1];
            pBVar19 = pBVar10 + lVar13 + 0x20;
            *(undefined8 *)pBVar19 = *puVar1;
            *(undefined8 *)(pBVar19 + 8) = uVar2;
            puVar1 = (undefined8 *)((long)local_48 + lVar13 + 0x30);
            uVar2 = puVar1[1];
            *(undefined8 *)(pBVar19 + 0x10) = *puVar1;
            *(undefined8 *)(pBVar19 + 0x18) = uVar2;
            lVar13 = lVar13 + 0x20;
          } while (pBVar19 + 0x20 < pBVar10 + uVar9);
        }
        goto LAB_001cd2b5;
      }
      seqStore->lit = pBVar10 + uVar9;
    }
    psVar22 = seqStore->sequences;
    psVar22->litLength = (U16)uVar9;
    psVar22->offBase = (U32)uVar14;
    if (uVar8 < 3) {
LAB_001cd5bd:
      __assert_fail("matchLength >= MINMATCH",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,700,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (0xffff < uVar8 - 3) {
      if (seqStore->longLengthType != ZSTD_llt_none) {
LAB_001cd61a:
        __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                      ,0x2bf,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      seqStore->longLengthType = ZSTD_llt_matchLength;
      seqStore->longLengthPos = (U32)((ulong)((long)psVar22 - (long)seqStore->sequencesStart) >> 3);
    }
    psVar22->mlBase = (U16)(uVar8 - 3);
    psVar22 = psVar22 + 1;
    seqStore->sequences = psVar22;
    if (local_c0->lazySkipping != 0) {
      local_c0->lazySkipping = 0;
    }
    uVar4 = local_b4;
    for (piVar15 = (int *)((long)piVar15 + uVar8); UVar21 = uVar4, piVar12 = piVar15, ms = local_c0,
        piVar15 <= local_60; piVar15 = (int *)((long)piVar15 + sVar7 + 4)) {
      iVar6 = (int)piVar15 - (int)local_88;
      UVar11 = (local_c0->window).lowLimit;
      UVar18 = iVar6 - maxDistance;
      if (iVar6 - UVar11 <= maxDistance) {
        UVar18 = UVar11;
      }
      if (local_c0->loadedDictEnd != 0) {
        UVar18 = UVar11;
      }
      uVar4 = iVar6 - local_cc;
      pBVar10 = local_88;
      if (uVar4 < (uint)local_b0) {
        pBVar10 = local_78;
      }
      if (((local_a8 - uVar4 < 3) || (iVar6 - UVar18 < local_cc)) ||
         (*piVar15 != *(int *)(pBVar10 + uVar4))) break;
      piVar12 = iEnd;
      if (uVar4 < (uint)local_b0) {
        piVar12 = local_68;
      }
      sVar7 = ZSTD_count_2segments
                        ((BYTE *)(piVar15 + 1),(BYTE *)((long)(pBVar10 + uVar4) + 4),(BYTE *)iEnd,
                         (BYTE *)piVar12,local_80);
      if (seqStore->maxNbSeq <= (ulong)((long)psVar22 - (long)seqStore->sequencesStart >> 3))
      goto LAB_001cd57f;
      if (0x20000 < seqStore->maxNbLit) goto LAB_001cd59e;
      pBVar10 = seqStore->lit;
      if (seqStore->litStart + seqStore->maxNbLit < pBVar10) goto LAB_001cd5dc;
      if (iEnd < piVar15) goto LAB_001cd5fb;
      if (local_50 < piVar15) {
        ZSTD_safecopyLiterals(pBVar10,(BYTE *)piVar15,(BYTE *)piVar15,(BYTE *)local_50);
      }
      else {
        uVar2 = *(undefined8 *)(piVar15 + 2);
        *(undefined8 *)pBVar10 = *(undefined8 *)piVar15;
        *(undefined8 *)(pBVar10 + 8) = uVar2;
      }
      psVar22 = seqStore->sequences;
      psVar22->litLength = 0;
      psVar22->offBase = 1;
      if (sVar7 + 4 < 3) goto LAB_001cd5bd;
      if (0xffff < sVar7 + 1) {
        if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_001cd61a;
        seqStore->longLengthType = ZSTD_llt_matchLength;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar22 - (long)seqStore->sequencesStart) >> 3);
      }
      psVar22->mlBase = (U16)(sVar7 + 1);
      psVar22 = psVar22 + 1;
      seqStore->sequences = psVar22;
      uVar4 = local_cc;
      local_cc = UVar21;
    }
  } while( true );
}

Assistant:

size_t ZSTD_compressBlock_btlazy2_extDict(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)

{
    return ZSTD_compressBlock_lazy_extDict_generic(ms, seqStore, rep, src, srcSize, search_binaryTree, 2);
}